

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator=(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *other)

{
  Rep *pRVar1;
  Rep *pRVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (this != other) {
    if ((this->super_RepeatedPtrFieldBase).arena_ == (other->super_RepeatedPtrFieldBase).arena_) {
      iVar4 = (this->super_RepeatedPtrFieldBase).current_size_;
      iVar5 = (this->super_RepeatedPtrFieldBase).total_size_;
      pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
      iVar3 = (other->super_RepeatedPtrFieldBase).total_size_;
      pRVar2 = (other->super_RepeatedPtrFieldBase).rep_;
      (this->super_RepeatedPtrFieldBase).current_size_ =
           (other->super_RepeatedPtrFieldBase).current_size_;
      (this->super_RepeatedPtrFieldBase).total_size_ = iVar3;
      (this->super_RepeatedPtrFieldBase).rep_ = pRVar2;
      (other->super_RepeatedPtrFieldBase).current_size_ = iVar4;
      (other->super_RepeatedPtrFieldBase).total_size_ = iVar5;
      (other->super_RepeatedPtrFieldBase).rep_ = pRVar1;
    }
    else {
      internal::RepeatedPtrFieldBase::
      CopyFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
    }
  }
  return this;
}

Assistant:

inline RepeatedPtrField<Element>& RepeatedPtrField<Element>::operator=(
    RepeatedPtrField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (this->GetArena() != other.GetArena()) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}